

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
::operator+=(List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
             *this,List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                   *column)

{
  ID_index IVar1;
  Dimension DVar2;
  bool bVar3;
  
  bVar3 = List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
          ::
          _add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>
                    ((List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
                      *)this,column);
  if (bVar3) {
    IVar1 = (this->super_Chain_column_option).pivot_;
    (this->super_Chain_column_option).pivot_ = (column->super_Chain_column_option).pivot_;
    (column->super_Chain_column_option).pivot_ = IVar1;
    DVar2 = (this->super_Column_dimension_option).dim_;
    (this->super_Column_dimension_option).dim_ = (column->super_Column_dimension_option).dim_;
    (column->super_Column_dimension_option).dim_ = DVar2;
  }
  return this;
}

Assistant:

inline List_column<Master_matrix>& List_column<Master_matrix>::operator+=(List_column& column)
{
  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
    // assumes that the addition never zeros out this column.
    if (_add(column)) {
      Chain_opt::swap_pivots(column);
      Dim_opt::swap_dimension(column);
    }
  } else {
    _add(column);
  }

  return *this;
}